

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O2

int __thiscall
QFontDatabasePrivate::addAppFont(QFontDatabasePrivate *this,QByteArray *fontData,QString *fileName)

{
  Data *pDVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  int iVar4;
  qsizetype *pqVar5;
  undefined4 extraout_var;
  pointer pAVar6;
  QFontCache *this_00;
  int iVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<QString> local_130;
  QArrayDataPointer<char16_t> local_118;
  QArrayDataPointer<char16_t> local_f8;
  ApplicationFont local_d8;
  ApplicationFont local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88.properties.d.d = (Data *)0x0;
  local_88.properties.d.ptr = (Properties *)0x0;
  local_88.data.d.ptr = (char *)0x0;
  local_88.data.d.size = 0;
  local_88.fileName.d.size = 0;
  local_88.data.d.d = (Data *)0x0;
  local_88.fileName.d.d = (Data *)0x0;
  local_88.fileName.d.ptr = (char16_t *)0x0;
  local_88.properties.d.size = 0;
  QByteArray::operator=(&local_88.data,fontData);
  QString::operator=(&local_88.fileName,(QString *)fileName);
  pqVar5 = &(((this->applicationFonts).d.ptr)->fileName).d.size;
  for (uVar8 = 0; (this->applicationFonts).d.size != uVar8; uVar8 = uVar8 + 1) {
    if (*pqVar5 == 0) goto LAB_00429b94;
    pqVar5 = pqVar5 + 9;
  }
  local_d8.properties.d.d = (Data *)0x0;
  local_d8.properties.d.ptr = (Properties *)0x0;
  local_d8.data.d.ptr = (char *)0x0;
  local_d8.data.d.size = 0;
  local_d8.fileName.d.size = 0;
  local_d8.data.d.d = (Data *)0x0;
  local_d8.fileName.d.d = (Data *)0x0;
  local_d8.fileName.d.ptr = (char16_t *)0x0;
  local_d8.properties.d.size = 0;
  QList<QFontDatabasePrivate::ApplicationFont>::emplaceBack<QFontDatabasePrivate::ApplicationFont>
            (&this->applicationFonts,&local_d8);
  ApplicationFont::~ApplicationFont(&local_d8);
  uVar8 = (ulong)((int)(this->applicationFonts).d.size - 1);
LAB_00429b94:
  iVar7 = (int)uVar8;
  if ((local_88.fileName.d.size == 0) && ((fontData->d).size != 0)) {
    QString::number((int)&local_118,iVar7);
    local_d8.data.d.ptr = (char *)local_118.size;
    local_d8.data.d.d = (Data *)local_118.ptr;
    local_d8.fileName.d.size = (qsizetype)local_118.d;
    local_d8.fileName.d.d = (Data *)0xe;
    local_d8.fileName.d.ptr = L":qmemoryfonts/";
    local_118.d = (Data *)0x0;
    local_118.ptr = (char16_t *)0x0;
    local_118.size = 0;
    QStringBuilder<QLatin1String,_QString>::convertTo<QString>
              ((QString *)&local_f8,(QStringBuilder<QLatin1String,_QString> *)&local_d8);
    qVar3 = local_88.fileName.d.size;
    pcVar2 = local_88.fileName.d.ptr;
    pDVar1 = local_88.fileName.d.d;
    local_88.fileName.d.d = local_f8.d;
    local_88.fileName.d.ptr = local_f8.ptr;
    local_f8.d = pDVar1;
    local_f8.ptr = pcVar2;
    local_88.fileName.d.size = local_f8.size;
    local_f8.size = qVar3;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&local_d8.fileName.d.size);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_118);
  }
  iVar4 = (*QGuiApplicationPrivate::platform_integration->_vptr_QPlatformIntegration[0xd])();
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x38))
            (&local_130,(long *)CONCAT44(extraout_var,iVar4),&local_88.data,&local_88,&local_88);
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_130);
  if (local_88.properties.d.size == 0) {
    iVar7 = -1;
  }
  else {
    pAVar6 = QList<QFontDatabasePrivate::ApplicationFont>::data(&this->applicationFonts);
    ApplicationFont::operator=(pAVar6 + iVar7,&local_88);
    this_00 = QFontCache::instance();
    QFontCache::clear(this_00);
    QCache<QtFontFallbacksCacheKey,_QList<QString>_>::clear(&this->fallbacksCache);
    QGuiApplication::fontDatabaseChanged(QCoreApplication::self);
  }
  ApplicationFont::~ApplicationFont(&local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

int QFontDatabasePrivate::addAppFont(const QByteArray &fontData, const QString &fileName)
{
    QFontDatabasePrivate::ApplicationFont font;
    font.data = fontData;
    font.fileName = fileName;

    Q_TRACE(QFontDatabasePrivate_addAppFont, fileName);

    int i;
    for (i = 0; i < applicationFonts.size(); ++i)
        if (applicationFonts.at(i).isNull())
            break;
    if (i >= applicationFonts.size()) {
        applicationFonts.append(ApplicationFont());
        i = applicationFonts.size() - 1;
    }

    if (font.fileName.isEmpty() && !fontData.isEmpty())
        font.fileName = ":qmemoryfonts/"_L1 + QString::number(i);

    auto *platformFontDatabase = QGuiApplicationPrivate::platformIntegration()->fontDatabase();
    platformFontDatabase->addApplicationFont(font.data, font.fileName, &font);
    if (font.properties.isEmpty())
        return -1;

    applicationFonts[i] = font;

    // The font cache may have cached lookups for the font that was now
    // loaded, so it has to be flushed.
    QFontCache::instance()->clear();

    fallbacksCache.clear();

    emit qApp->fontDatabaseChanged();

    return i;
}